

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::parsing::Trivia_const*>::emplace_back<slang::parsing::Trivia_const*>
          (SmallVectorBase<slang::parsing::Trivia_const*> *this,Trivia **args)

{
  iterator ppTVar1;
  Trivia **args_local;
  SmallVectorBase<const_slang::parsing::Trivia_*> *this_local;
  
  if (*(long *)(this + 8) == *(long *)(this + 0x10)) {
    ppTVar1 = SmallVectorBase<const_slang::parsing::Trivia_*>::end
                        ((SmallVectorBase<const_slang::parsing::Trivia_*> *)this);
    this_local = (SmallVectorBase<const_slang::parsing::Trivia_*> *)
                 emplaceRealloc<slang::parsing::Trivia_const*>(this,ppTVar1,args);
  }
  else {
    ppTVar1 = SmallVectorBase<const_slang::parsing::Trivia_*>::end
                        ((SmallVectorBase<const_slang::parsing::Trivia_*> *)this);
    *ppTVar1 = *args;
    *(long *)(this + 8) = *(long *)(this + 8) + 1;
    this_local = (SmallVectorBase<const_slang::parsing::Trivia_*> *)
                 SmallVectorBase<const_slang::parsing::Trivia_*>::back
                           ((SmallVectorBase<const_slang::parsing::Trivia_*> *)this);
  }
  return (reference)this_local;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }